

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
gl3cts::TransformFeedbackOverflowQueryBasicSingleStreamInterleavedAttribs::iterate
          (TransformFeedbackOverflowQueryBasicSingleStreamInterleavedAttribs *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TransformFeedbackOverflowQuerySingleStreamBase).
             super_TransformFeedbackOverflowQueryFunctionalBase.
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x30))(0);
  TransformFeedbackOverflowQueryFunctionalBase::drawPoints
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,10);
  (**(code **)(lVar2 + 0x638))();
  TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\0');
  (**(code **)(lVar2 + 0x30))(0);
  TransformFeedbackOverflowQueryFunctionalBase::drawPoints
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,0xb);
  (**(code **)(lVar2 + 0x638))();
  TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\x01');
  tcu::TestContext::setTestResult
            ((this->super_TransformFeedbackOverflowQuerySingleStreamBase).
             super_TransformFeedbackOverflowQueryFunctionalBase.
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult iterate()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		// Call BeginTransformFeedback with mode POINTS.
		gl.beginTransformFeedback(GL_POINTS);

		// Start the query, submit draw that results in feeding back exactly 10
		// points, then stop the query.
		drawPoints(10);

		// Call EndTransformFeedback.
		gl.endTransformFeedback();

		// Use the basic checking mechanism to validate that the result of the
		// query is FALSE.
		verifyQueryResults(GL_FALSE);

		// Repeat the above steps, but this time feed back more than 10 vertices
		// and expect the result of the query to be TRUE.
		gl.beginTransformFeedback(GL_POINTS);
		drawPoints(11);
		gl.endTransformFeedback();
		verifyQueryResults(GL_TRUE);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}